

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O0

int sf_sizeofheaders(GlobalVars *gv,lword addr,lword *res)

{
  Phdr *pPVar1;
  MemoryDescr *pMVar2;
  MemoryDescr *in_RDX;
  GlobalVars *in_RSI;
  GlobalVars *in_RDI;
  char *unaff_retaddr;
  GlobalVars *in_stack_00000008;
  MemoryDescr *in_stack_ffffffffffffffd8;
  MemoryDescr *in_stack_ffffffffffffffe0;
  
  pPVar1 = find_phdr(in_RSI,(char *)in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (pPVar1 == (Phdr *)0x0) {
    add_phdr(in_stack_00000008,unaff_retaddr,(uint32_t)((ulong)in_RDI >> 0x20),
             (uint16_t)((ulong)in_RDI >> 0x10),(lword)in_RSI,in_RDX,(MemoryDescr *)gv);
  }
  pMVar2 = (MemoryDescr *)(*fff[in_RDI->dest_format]->headersize)(in_RDI);
  in_RDX->next = pMVar2;
  return 1;
}

Assistant:

static int sf_sizeofheaders(struct GlobalVars *gv,lword addr,lword *res)
{
  /* SIZEOF_HEADERS means that we want to include File- and PHDR in
     the first ELF segment */
  if (!find_phdr(gv,defhdr,defmem,defmem))
    add_phdr(gv,defhdr,PT_PHDR,PHDR_PHDRS,ADDR_NONE,defmem,defmem);

  *res = fff[gv->dest_format]->headersize(gv);
  return 1;
}